

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dfloors.cpp
# Opt level: O0

bool P_CheckFor3DFloorHit(AActor *mo,double z)

{
  F3DFloor *pFVar1;
  double dVar2;
  bool bVar3;
  xfloor *this;
  F3DFloor **ppFVar4;
  ASectorAction *pAVar5;
  F3DFloor *rover;
  iterator __end1;
  iterator __begin1;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range1;
  double z_local;
  AActor *mo_local;
  
  if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000U) == 0)) {
    this = &mo->Sector->e->XFloor;
    __end1 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this);
    rover = (F3DFloor *)TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this);
    while (bVar3 = TIterator<F3DFloor_*>::operator!=(&__end1,(TIterator<F3DFloor_*> *)&rover), bVar3
          ) {
      ppFVar4 = TIterator<F3DFloor_*>::operator*(&__end1);
      pFVar1 = *ppFVar4;
      if (((((pFVar1->flags & 1) != 0) && ((pFVar1->flags & 2) != 0)) &&
          (pAVar5 = TObjPtr::operator_cast_to_ASectorAction_
                              ((TObjPtr *)&pFVar1->model->SecActTarget),
          pAVar5 != (ASectorAction *)0x0)) &&
         (dVar2 = secplane_t::ZatPoint((pFVar1->top).plane,mo), ABS(z - dVar2) < 1.52587890625e-05))
      {
        pAVar5 = TObjPtr<ASectorAction>::operator->(&pFVar1->model->SecActTarget);
        ASectorAction::TriggerAction(pAVar5,mo,4);
        return true;
      }
      TIterator<F3DFloor_*>::operator++(&__end1);
    }
  }
  return false;
}

Assistant:

bool P_CheckFor3DFloorHit(AActor * mo, double z)
{
	if ((mo->player && (mo->player->cheats & CF_PREDICTING))) return false;

	for (auto rover : mo->Sector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_EXISTS)) continue;

		if(rover->flags & FF_SOLID && rover->model->SecActTarget)
		{
			if (fabs(z - rover->top.plane->ZatPoint(mo)) < EQUAL_EPSILON) 
			{
				rover->model->SecActTarget->TriggerAction (mo, SECSPAC_HitFloor);
				return true;
			}
		}
	}
	return false;
}